

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

FieldDescriptor * google::protobuf::compiler::java::MapValueField(FieldDescriptor *descriptor)

{
  bool bVar1;
  Type *v1;
  Type *v2;
  char *failure_msg;
  LogMessage *pLVar2;
  MessageOptions *this;
  FieldDescriptor *pFVar3;
  LogMessage local_68;
  Voidify local_51;
  Descriptor *local_50;
  Descriptor *message;
  LogMessage local_38;
  Voidify local_21;
  Type local_20 [2];
  Nullable<const_char_*> local_18;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *descriptor_local;
  
  local_20[1] = 0xb;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)descriptor;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>(local_20 + 1);
  local_20[0] = FieldDescriptor::type((FieldDescriptor *)absl_log_internal_check_op_result);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>(local_20);
  local_18 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                       (v1,v2,"FieldDescriptor::TYPE_MESSAGE == descriptor->type()");
  if (local_18 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_18);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
               ,0x397,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  local_50 = FieldDescriptor::message_type((FieldDescriptor *)absl_log_internal_check_op_result);
  this = Descriptor::options(local_50);
  bVar1 = MessageOptions::map_entry(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pFVar3 = Descriptor::map_value(local_50);
    return pFVar3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
             ,0x399,"message->options().map_entry()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

const FieldDescriptor* MapValueField(const FieldDescriptor* descriptor) {
  ABSL_CHECK_EQ(FieldDescriptor::TYPE_MESSAGE, descriptor->type());
  const Descriptor* message = descriptor->message_type();
  ABSL_CHECK(message->options().map_entry());
  return message->map_value();
}